

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_scalar.c
# Opt level: O1

void scalar_define_bang(_glist *x)

{
  t_gpointer gp;
  t_gpointer tStack_28;
  
  if ((x->gl_list != (t_gobj *)0x0) && (x->gl_list->g_pd == scalar_class)) {
    gpointer_init(&tStack_28);
    gpointer_setglist(&tStack_28,x,(t_scalar *)x->gl_list);
    outlet_pointer((x->gl_obj).te_outlet,&tStack_28);
    gpointer_unset(&tStack_28);
    return;
  }
  bug("scalar_define_bang");
  return;
}

Assistant:

static void scalar_define_bang(t_glist *x)
{
    if (x->gl_list && pd_class(&x->gl_list->g_pd) == scalar_class)
    {
        t_gpointer gp;
        gpointer_init(&gp);
        gpointer_setglist(&gp, x, (t_scalar *)&x->gl_list->g_pd);
        outlet_pointer(x->gl_obj.ob_outlet, &gp);
        gpointer_unset(&gp);
    }
    else bug("scalar_define_bang");
}